

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O1

JsErrorCode
JsCreateExternalObjectWithPrototype
          (void *data,JsFinalizeCallback finalizeCallback,JsValueRef prototype,JsValueRef *object)

{
  ScriptContext *pSVar1;
  BOOL BVar2;
  JsrtContext *pJVar3;
  RecyclableObject *pRVar4;
  JsrtExternalObject *pJVar5;
  JsErrorCode JVar6;
  AutoNestedHandledExceptionType local_68 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  undefined1 auStack_48 [8];
  TTDRecorder _actionEntryPopper;
  
  auStack_48 = (undefined1  [8])0x0;
  _actionEntryPopper.m_actionEvent = (EventLogEntry *)0x0;
  pJVar3 = JsrtContext::GetCurrent();
  JVar6 = JsErrorNoCurrentContext;
  if (pJVar3 == (JsrtContext *)0x0) goto LAB_0037107b;
  pSVar1 = (((pJVar3->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  _actionEntryPopper.m_resultPtr = (TTDVar *)pSVar1;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_68,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  if (pSVar1->TTDShouldPerformRecordAction == true) {
    TTD::EventLog::RecordJsRTAllocateExternalObject
              (*(EventLog **)((long)_actionEntryPopper.m_resultPtr[0x77] + 0x16b8),
               (TTDJsRTActionResultAutoRecorder *)auStack_48,prototype);
  }
  if (object == (JsValueRef *)0x0) {
    JVar6 = JsErrorNullArgument;
  }
  else {
    if (prototype == (JsValueRef)0x0) {
      pRVar4 = (RecyclableObject *)0x0;
    }
    else {
      BVar2 = Js::JavascriptOperators::IsObject(prototype);
      if (BVar2 == 0) {
        JVar6 = JsErrorArgumentNotObject;
        goto LAB_00371072;
      }
      pRVar4 = Js::VarTo<Js::RecyclableObject>(prototype);
      pSVar1 = (((((pRVar4->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
      if (pSVar1 != (ScriptContext *)_actionEntryPopper.m_resultPtr) {
        JVar6 = JsErrorWrongRuntime;
        if (pSVar1->threadContext != (ThreadContext *)_actionEntryPopper.m_resultPtr[0x77])
        goto LAB_00371072;
        prototype = Js::CrossSite::MarshalVar
                              ((ScriptContext *)_actionEntryPopper.m_resultPtr,pRVar4,false);
      }
      pRVar4 = Js::VarTo<Js::RecyclableObject>(prototype);
    }
    JVar6 = JsNoError;
    pJVar5 = JsrtExternalObject::Create
                       (data,0,finalizeCallback,pRVar4,
                        (ScriptContext *)_actionEntryPopper.m_resultPtr,(JsrtExternalType *)0x0);
    *object = pJVar5;
    if (*(char *)((long)_actionEntryPopper.m_resultPtr + 0x143d) == '\x01') {
      if (_actionEntryPopper.m_actionEvent == (EventLogEntry *)0x0) {
        TTDAbort_unrecoverable_error("Why are we calling this then???");
      }
      *(JsrtExternalObject **)_actionEntryPopper.m_actionEvent = pJVar5;
    }
  }
LAB_00371072:
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_68);
LAB_0037107b:
  if (auStack_48 != (undefined1  [8])0x0) {
    if (*(int32 *)((long)auStack_48 + 4) != -1) {
      TTDAbort_unrecoverable_error("Hmm this got changed somewhere???");
    }
    *(JsErrorCode *)((long)auStack_48 + 4) = JVar6;
  }
  return JVar6;
}

Assistant:

CHAKRA_API JsCreateExternalObjectWithPrototype(_In_opt_ void *data,
    _In_opt_ JsFinalizeCallback finalizeCallback,
    _In_opt_ JsValueRef prototype,
    _Out_ JsValueRef *object)
{
    return ContextAPINoScriptWrapper([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTAllocateExternalObject, prototype);

        PARAM_NOT_NULL(object);

        Js::RecyclableObject * prototypeObject = nullptr;
        if (prototype != JS_INVALID_REFERENCE)
        {
            VALIDATE_INCOMING_OBJECT(prototype, scriptContext);
            prototypeObject = Js::VarTo<Js::RecyclableObject>(prototype);
        }

        *object = JsrtExternalObject::Create(data, 0, finalizeCallback, prototypeObject, scriptContext, nullptr);

        PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, object);

        return JsNoError;
    });
}